

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_context.cpp
# Opt level: O0

bool __thiscall r_exec::HLPContext::evaluate_no_dereference(HLPContext *this,uint16_t *result_index)

{
  Data DVar1;
  Atom *pAVar2;
  undefined1 uVar3;
  uint8_t id;
  bool bVar4;
  uint16_t uVar5;
  int iVar6;
  HLPBindingMap *this_00;
  Atom *intermediate_results;
  _Context *implementation;
  HLPContext local_108;
  HLPContext local_e8;
  uint16_t local_c6;
  ushort local_c4;
  ushort local_c2;
  undefined1 local_c0 [2];
  uint16_t unused_result_index_1;
  uint16_t i_1;
  uint16_t atom_count_1;
  Context _c;
  HLPContext *c_1;
  Operator op;
  HLPContext local_78;
  uint16_t local_56;
  ushort local_54;
  ushort local_52;
  undefined4 uStack_50;
  uint16_t unused_result_index;
  uint16_t i;
  uint16_t atom_count;
  undefined1 local_40 [8];
  HLPContext c;
  uint16_t *result_index_local;
  HLPContext *this_local;
  
  DVar1 = (this->super__Context).data;
  if (DVar1 - VALUE_ARRAY < 2) {
    this_local._7_1_ = true;
  }
  else if (DVar1 == UNDEFINED) {
    this_local._7_1_ = false;
  }
  else {
    c.super__Context._24_8_ = result_index;
    uVar3 = r_code::Atom::getDescriptor();
    switch(uVar3) {
    case 0x8d:
      pAVar2 = (this->super__Context).code;
      uVar5 = r_code::Atom::asIndex();
      HLPContext((HLPContext *)local_40,pAVar2,uVar5,(HLPOverlay *)(this->super__Context).overlay,
                 STEM);
      this_local._7_1_ =
           evaluate_no_dereference((HLPContext *)local_40,(uint16_t *)c.super__Context._24_8_);
      if (this_local._7_1_) {
        this_00 = core::P<r_exec::HLPBindingMap>::operator->
                            ((P<r_exec::HLPBindingMap> *)((this->super__Context).overlay + 1));
        pAVar2 = (this->super__Context).code;
        id = r_code::Atom::asAssignmentIndex();
        uVar5 = r_code::Atom::asIndex();
        intermediate_results =
             r_code::vector<r_code::Atom>::operator[](&((this->super__Context).overlay)->values,0);
        BindingMap::bind_variable(&this_00->super_BindingMap,pAVar2,id,uVar5,intermediate_results);
      }
      uStack_50 = 1;
      ~HLPContext((HLPContext *)local_40);
      break;
    default:
      *(uint16_t *)c.super__Context._24_8_ = (this->super__Context).index;
      this_local._7_1_ = true;
      break;
    case 0xc1:
    case 0xc2:
    case 0xc3:
    case 0xc4:
    case 200:
    case 0xc9:
    case 0xca:
    case 0xcb:
    case 0xcc:
    case 0xcd:
    case 0xce:
      iVar6 = (*(this->super__Context)._vptr__Context[6])();
      local_c2 = (ushort)iVar6;
      for (local_c4 = 1; local_c4 <= local_c2; local_c4 = local_c4 + 1) {
        getChild(&local_108,this,local_c4);
        operator*(&local_e8,&local_108);
        bVar4 = evaluate_no_dereference(&local_e8,&local_c6);
        ~HLPContext(&local_e8);
        ~HLPContext(&local_108);
        if (((bVar4 ^ 0xffU) & 1) != 0) {
          return false;
        }
      }
      *(uint16_t *)c.super__Context._24_8_ = (this->super__Context).index;
      this_local._7_1_ = true;
      break;
    case 0xc5:
      iVar6 = (*(this->super__Context)._vptr__Context[6])();
      local_52 = (ushort)iVar6;
      for (local_54 = 1; local_54 <= local_52; local_54 = local_54 + 1) {
        getChild((HLPContext *)&op._overload,this,local_54);
        operator*(&local_78,(HLPContext *)&op._overload);
        bVar4 = evaluate_no_dereference(&local_78,&local_56);
        ~HLPContext(&local_78);
        ~HLPContext((HLPContext *)&op._overload);
        if (((bVar4 ^ 0xffU) & 1) != 0) {
          return false;
        }
      }
      operator[](this,0);
      uVar5 = r_code::Atom::asOpcode();
      Operator::Get((Operator *)&c_1,uVar5);
      implementation = (_Context *)operator_new(0x20);
      HLPContext((HLPContext *)implementation,this);
      _c.implementation = implementation;
      Context::Context((Context *)local_c0,implementation);
      this_local._7_1_ =
           Operator::operator()
                     ((Operator *)&c_1,(Context *)local_c0,(uint16_t *)c.super__Context._24_8_);
      uStack_50 = 1;
      Context::~Context((Context *)local_c0);
      Operator::~Operator((Operator *)&c_1);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool HLPContext::evaluate_no_dereference(uint16_t &result_index) const
{
    switch (data) {
    case VALUE_ARRAY:
    case BINDING_MAP:
        return true;

    case UNDEFINED:
        return false;

    default:
        break;
    }

    switch (code[index].getDescriptor()) {
    case Atom::ASSIGN_PTR: {
        HLPContext c(code, code[index].asIndex(), (HLPOverlay *)overlay);

        if (c.evaluate_no_dereference(result_index)) {
            ((HLPOverlay *)overlay)->bindings->bind_variable(code, code[index].asAssignmentIndex(), code[index].asIndex(), &overlay->values[0]);
            return true;
        } else {
            return false;
        }
    }

    case Atom::OPERATOR: {
        uint16_t atom_count = getChildrenCount();

        for (uint16_t i = 1; i <= atom_count; ++i) {
            uint16_t unused_result_index;

            if (!(*getChild(i)).evaluate_no_dereference(unused_result_index)) {
                return false;
            }
        }

        Operator op = Operator::Get((*this)[0].asOpcode());
        HLPContext *c = new HLPContext(*this);
        Context _c(c);
        return op(_c, result_index);
    }

    case Atom::OBJECT:
    case Atom::MARKER:
    case Atom::INSTANTIATED_PROGRAM:
    case Atom::INSTANTIATED_CPP_PROGRAM:
    case Atom::INSTANTIATED_INPUT_LESS_PROGRAM:
    case Atom::INSTANTIATED_ANTI_PROGRAM:
    case Atom::COMPOSITE_STATE:
    case Atom::MODEL:
    case Atom::GROUP:
    case Atom::SET:
    case Atom::S_SET: {
        uint16_t atom_count = getChildrenCount();

        for (uint16_t i = 1; i <= atom_count; ++i) {
            uint16_t unused_result_index;

            if (!(*getChild(i)).evaluate_no_dereference(unused_result_index)) {
                return false;
            }
        }

        result_index = index;
        return true;
    }

    default:
        result_index = index;
        return true;
    }
}